

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char cVar1;
  size_t sVar2;
  SemanticAnalyser semantic;
  ifstream sourceFile;
  undefined1 local_560 [64];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_520;
  SemanticAnalyser local_4f0;
  undefined1 local_448 [560];
  istream local_218 [520];
  
  if (argc == 2) {
    std::ifstream::ifstream(local_218,argv[1],_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Could not open provided source file!\n",0x25);
    }
    else {
      Parser::Parser((Parser *)(local_560 + 0x28),local_218);
      SemanticAnalyser::SemanticAnalyser(&local_4f0);
      Executor::Executor((Executor *)local_448);
      Parser::parseProgram((Parser *)local_560);
      (**(code **)(*(long *)local_560._0_8_ + 0x10))(local_560._0_8_,&local_4f0);
      (**(code **)(*(long *)local_560._0_8_ + 0x10))(local_560._0_8_,local_448);
      std::ifstream::close();
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_560._8_8_,local_560._16_8_);
      if (local_560._8_8_ != (long)local_560 + 0x18) {
        operator_delete((void *)local_560._8_8_,local_560._24_8_ + 1);
      }
      if ((istream *)local_560._0_8_ != (istream *)0x0) {
        (**(code **)(*(long *)local_560._0_8_ + 8))();
      }
      local_448._0_8_ = &PTR__Executor_00150380;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_448 + 0xb0));
      std::ios_base::~ios_base((ios_base *)(local_448 + 0x120));
      std::
      deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
      ::~deque((deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
                *)(local_448 + 0x60));
      std::
      deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
                *)(local_448 + 0x10));
      if ((__uniq_ptr_impl<Value,_std::default_delete<Value>_>)local_448._8_8_ !=
          (__uniq_ptr_impl<Value,_std::default_delete<Value>_>)0x0) {
        (**(code **)(*(long *)local_448._8_8_ + 8))();
      }
      local_4f0.super_Visitor._vptr_Visitor = (_func_int **)&PTR__SemanticAnalyser_0014ffe8;
      std::_Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
      ::~_Deque_base((_Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
                      *)&local_4f0.hasReturn_);
      std::
      deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>_>_>
      ::~deque(&local_4f0.symbols_.scopes_);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [local_520.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                ((anon_class_1_0_00000001 *)local_448,&local_520);
    }
    std::ifstream::~ifstream(local_218);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1521c0);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," source_file\n",0xd);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  if(argc != 2)
  {
    std::cout << "Usage: " << argv[0] << " source_file\n";
    return 0;
  }

  try
  {
    std::ifstream sourceFile{argv[1]};
    if(!sourceFile.is_open())
    {
      std::cout << "Could not open provided source file!\n";
      return 0;
    }

    Parser parser{sourceFile};
    //PrintVisitor printer{};
    SemanticAnalyser semantic{};
    Executor executor{};
    
    auto program = parser.parseProgram();
    //program->accept(printer);
    program->accept(semantic);
    program->accept(executor);
    
    sourceFile.close();

    std::cout << executor.getStandardOut();
  }
  catch(std::runtime_error& er)
  {
    std::cout << er.what() << "\n";
  }

  return 0;
}